

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O0

int checkpanic(lua_State *L)

{
  lua_State *L_00;
  int iVar1;
  char *pcVar2;
  lua_Alloc f_00;
  lua_State *L_01;
  lua_Alloc f;
  char *code;
  lua_State *L1;
  void *ud;
  Aux b;
  lua_State *L_local;
  
  b.L = L;
  pcVar2 = luaL_checklstring(L,1,(size_t *)0x0);
  f_00 = lua_getallocf(b.L,&L1);
  b.jb[0].__saved_mask.__val[0xf] = (unsigned_long)luaL_optlstring(b.L,2,"",(size_t *)0x0);
  b.paniccode = (char *)b.L;
  L_01 = lua_newstate(f_00,L1);
  if (L_01 == (lua_State *)0x0) {
    lua_pushnil(b.L);
  }
  else {
    lua_atpanic(L_01,panicback);
    lua_pushlightuserdata(L_01,&ud);
    lua_setfield(L_01,-0xf4628,"_jmpbuf");
    iVar1 = _setjmp((__jmp_buf_tag *)&ud);
    L_00 = b.L;
    if (iVar1 == 0) {
      runC(b.L,L_01,pcVar2);
      lua_pushstring(b.L,"no errors");
    }
    else {
      pcVar2 = lua_tolstring(L_01,-1,(size_t *)0x0);
      lua_pushstring(L_00,pcVar2);
    }
    lua_close(L_01);
  }
  return 1;
}

Assistant:

static int checkpanic (lua_State *L) {
  struct Aux b;
  void *ud;
  lua_State *L1;
  const char *code = luaL_checkstring(L, 1);
  lua_Alloc f = lua_getallocf(L, &ud);
  b.paniccode = luaL_optstring(L, 2, "");
  b.L = L;
  L1 = lua_newstate(f, ud);  /* create new state */
  if (L1 == NULL) {  /* error? */
    lua_pushnil(L);
    return 1;
  }
  lua_atpanic(L1, panicback);  /* set its panic function */
  lua_pushlightuserdata(L1, &b);
  lua_setfield(L1, LUA_REGISTRYINDEX, "_jmpbuf");  /* store 'Aux' struct */
  if (setjmp(b.jb) == 0) {  /* set jump buffer */
    runC(L, L1, code);  /* run code unprotected */
    lua_pushliteral(L, "no errors");
  }
  else {  /* error handling */
    /* move error message to original state */
    lua_pushstring(L, lua_tostring(L1, -1));
  }
  lua_close(L1);
  return 1;
}